

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::clearAccessChain(Builder *this)

{
  CoherentFlags *pCVar1;
  pointer puVar2;
  
  (this->accessChain).base = 0;
  puVar2 = (this->accessChain).indexChain.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->accessChain).indexChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->accessChain).indexChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  (this->accessChain).instr = 0;
  puVar2 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  (this->accessChain).isRValue = false;
  (this->accessChain).component = 0;
  (this->accessChain).preSwizzleBaseType = 0;
  pCVar1 = &(this->accessChain).coherentFlags;
  *(ushort *)pCVar1 = *(ushort *)pCVar1 & 0xf800;
  (this->accessChain).alignment = 0;
  return;
}

Assistant:

void Builder::clearAccessChain()
{
    accessChain.base = NoResult;
    accessChain.indexChain.clear();
    accessChain.instr = NoResult;
    accessChain.swizzle.clear();
    accessChain.component = NoResult;
    accessChain.preSwizzleBaseType = NoType;
    accessChain.isRValue = false;
    accessChain.coherentFlags.clear();
    accessChain.alignment = 0;
}